

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool mz_zip_writer_add_to_central_dir
                  (mz_zip_archive *pZip,char *pFilename,mz_uint16 filename_size,void *pExtra,
                  mz_uint16 extra_size,void *pComment,mz_uint16 comment_size,mz_uint64 uncomp_size,
                  mz_uint64 comp_size,mz_uint32 uncomp_crc32,mz_uint16 method,mz_uint16 bit_flags,
                  mz_uint16 dos_time,mz_uint16 dos_date,mz_uint64 param_15,mz_uint32 ext_attributes,
                  char *user_extra_data,mz_uint user_extra_data_len)

{
  ulong min_new_capacity;
  mz_bool mVar1;
  bool bVar2;
  mz_uint8 local_2f8 [8];
  mz_uint8 central_dir_header [46];
  size_t orig_central_dir_size;
  mz_zip_internal_state *pmStack_2b0;
  mz_uint32 central_dir_ofs;
  mz_zip_internal_state *pState;
  void *pComment_local;
  void *pvStack_298;
  mz_uint16 extra_size_local;
  void *pExtra_local;
  char *pcStack_288;
  mz_uint16 filename_size_local;
  char *pFilename_local;
  mz_zip_archive *pZip_local;
  undefined4 local_234;
  ulong local_230;
  mz_zip_internal_state *local_228;
  char *local_220;
  size_t local_210;
  size_t orig_size_5;
  void *local_200;
  mz_zip_array *local_1f8;
  char *local_1f0;
  uint local_1e8;
  undefined4 local_1e4;
  ulong local_1e0;
  mz_zip_array *local_1d8;
  char *local_1d0;
  int local_1c4;
  size_t local_1c0;
  size_t orig_size_4;
  mz_zip_internal_state *local_1b0;
  mz_zip_internal_state *local_1a8;
  char *local_1a0;
  uint local_198;
  undefined4 local_194;
  ulong local_190;
  mz_zip_internal_state *local_188;
  char *local_180;
  int local_174;
  size_t local_170;
  size_t orig_size_3;
  char *local_160;
  mz_zip_internal_state *local_158;
  char *local_150;
  uint local_148;
  undefined4 local_144;
  ulong local_140;
  mz_zip_internal_state *local_138;
  char *local_130;
  int local_124;
  size_t local_120;
  size_t orig_size_2;
  void *local_110;
  mz_zip_internal_state *local_108;
  char *local_100;
  uint local_f8;
  undefined4 local_f4;
  ulong local_f0;
  mz_zip_internal_state *local_e8;
  char *local_e0;
  int local_d4;
  size_t local_d0;
  size_t orig_size_1;
  char *local_c0;
  mz_zip_internal_state *local_b8;
  char *local_b0;
  uint local_a8;
  undefined4 local_a4;
  ulong local_a0;
  mz_zip_internal_state *local_98;
  char *local_90;
  int local_84;
  size_t local_80;
  size_t orig_size;
  mz_uint8 *local_70;
  mz_zip_internal_state *local_68;
  char *local_60;
  uint local_58;
  undefined4 local_54;
  ulong local_50;
  mz_zip_internal_state *local_48;
  char *local_40;
  int local_34;
  
  pmStack_2b0 = pZip->m_pState;
  orig_central_dir_size._4_4_ = (undefined4)(pmStack_2b0->m_central_dir).m_size;
  min_new_capacity = (pmStack_2b0->m_central_dir).m_size;
  if ((pZip->m_pState->m_zip64 == 0) && (0xffffffff < param_15)) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_FILE_TOO_LARGE;
    }
  }
  else if ((pmStack_2b0->m_central_dir).m_size + 0x2e + (ulong)filename_size + (ulong)extra_size +
           (ulong)user_extra_data_len + (ulong)comment_size < 0xffffffff) {
    pState = (mz_zip_internal_state *)pComment;
    pComment_local._6_2_ = extra_size;
    pvStack_298 = pExtra;
    pExtra_local._6_2_ = filename_size;
    pcStack_288 = pFilename;
    pFilename_local = (char *)pZip;
    mVar1 = mz_zip_writer_create_central_dir_header
                      (pZip,local_2f8,filename_size,extra_size + (short)user_extra_data_len,
                       comment_size,uncomp_size,comp_size,uncomp_crc32,method,bit_flags,dos_time,
                       dos_date,param_15,ext_attributes);
    if (mVar1 == 0) {
      if (pFilename_local != (char *)0x0) {
        pFilename_local[0x1c] = '\x1b';
        pFilename_local[0x1d] = '\0';
        pFilename_local[0x1e] = '\0';
        pFilename_local[0x1f] = '\0';
      }
    }
    else {
      local_70 = local_2f8;
      local_60 = pFilename_local;
      local_68 = pmStack_2b0;
      orig_size = 0x2e;
      local_80 = (pmStack_2b0->m_central_dir).m_size;
      local_50 = local_80 + 0x2e;
      local_40 = pFilename_local;
      local_48 = pmStack_2b0;
      local_54 = 1;
      if (((pmStack_2b0->m_central_dir).m_capacity < local_50) &&
         (mVar1 = mz_zip_array_ensure_capacity
                            ((mz_zip_archive *)pFilename_local,&pmStack_2b0->m_central_dir,local_50,
                             1), mVar1 == 0)) {
        local_34 = 0;
      }
      else {
        (local_48->m_central_dir).m_size = local_50;
        local_34 = 1;
      }
      bVar2 = local_34 != 0;
      if (bVar2) {
        memcpy((void *)((long)(local_68->m_central_dir).m_p +
                       local_80 * (local_68->m_central_dir).m_element_size),local_70,
               orig_size * (local_68->m_central_dir).m_element_size);
      }
      local_58 = (uint)bVar2;
      if (local_58 != 0) {
        orig_size_1 = (size_t)pExtra_local._6_2_;
        local_b0 = pFilename_local;
        local_b8 = pmStack_2b0;
        local_c0 = pcStack_288;
        local_d0 = (pmStack_2b0->m_central_dir).m_size;
        local_a0 = local_d0 + orig_size_1;
        local_90 = pFilename_local;
        local_98 = pmStack_2b0;
        local_a4 = 1;
        if (((pmStack_2b0->m_central_dir).m_capacity < local_a0) &&
           (mVar1 = mz_zip_array_ensure_capacity
                              ((mz_zip_archive *)pFilename_local,&pmStack_2b0->m_central_dir,
                               local_a0,1), mVar1 == 0)) {
          local_84 = 0;
        }
        else {
          (local_98->m_central_dir).m_size = local_a0;
          local_84 = 1;
        }
        bVar2 = local_84 != 0;
        if (bVar2) {
          memcpy((void *)((long)(local_b8->m_central_dir).m_p +
                         local_d0 * (local_b8->m_central_dir).m_element_size),local_c0,
                 orig_size_1 * (local_b8->m_central_dir).m_element_size);
        }
        local_a8 = (uint)bVar2;
        if (local_a8 != 0) {
          orig_size_2 = (size_t)pComment_local._6_2_;
          local_100 = pFilename_local;
          local_108 = pmStack_2b0;
          local_110 = pvStack_298;
          local_120 = (pmStack_2b0->m_central_dir).m_size;
          local_f0 = local_120 + orig_size_2;
          local_e0 = pFilename_local;
          local_e8 = pmStack_2b0;
          local_f4 = 1;
          if (((pmStack_2b0->m_central_dir).m_capacity < local_f0) &&
             (mVar1 = mz_zip_array_ensure_capacity
                                ((mz_zip_archive *)pFilename_local,&pmStack_2b0->m_central_dir,
                                 local_f0,1), mVar1 == 0)) {
            local_d4 = 0;
          }
          else {
            (local_e8->m_central_dir).m_size = local_f0;
            local_d4 = 1;
          }
          bVar2 = local_d4 != 0;
          if (bVar2) {
            memcpy((void *)((long)(local_108->m_central_dir).m_p +
                           local_120 * (local_108->m_central_dir).m_element_size),local_110,
                   orig_size_2 * (local_108->m_central_dir).m_element_size);
          }
          local_f8 = (uint)bVar2;
          if (local_f8 != 0) {
            orig_size_3 = (size_t)user_extra_data_len;
            local_150 = pFilename_local;
            local_158 = pmStack_2b0;
            local_160 = user_extra_data;
            local_170 = (pmStack_2b0->m_central_dir).m_size;
            local_140 = local_170 + orig_size_3;
            local_130 = pFilename_local;
            local_138 = pmStack_2b0;
            local_144 = 1;
            if (((pmStack_2b0->m_central_dir).m_capacity < local_140) &&
               (mVar1 = mz_zip_array_ensure_capacity
                                  ((mz_zip_archive *)pFilename_local,&pmStack_2b0->m_central_dir,
                                   local_140,1), mVar1 == 0)) {
              local_124 = 0;
            }
            else {
              (local_138->m_central_dir).m_size = local_140;
              local_124 = 1;
            }
            bVar2 = local_124 != 0;
            if (bVar2) {
              memcpy((void *)((long)(local_158->m_central_dir).m_p +
                             local_170 * (local_158->m_central_dir).m_element_size),local_160,
                     orig_size_3 * (local_158->m_central_dir).m_element_size);
            }
            local_148 = (uint)bVar2;
            if (local_148 != 0) {
              orig_size_4 = (size_t)comment_size;
              local_1a0 = pFilename_local;
              local_1a8 = pmStack_2b0;
              local_1b0 = pState;
              local_1c0 = (pmStack_2b0->m_central_dir).m_size;
              local_190 = local_1c0 + orig_size_4;
              local_180 = pFilename_local;
              local_188 = pmStack_2b0;
              local_194 = 1;
              if (((pmStack_2b0->m_central_dir).m_capacity < local_190) &&
                 (mVar1 = mz_zip_array_ensure_capacity
                                    ((mz_zip_archive *)pFilename_local,&pmStack_2b0->m_central_dir,
                                     local_190,1), mVar1 == 0)) {
                local_174 = 0;
              }
              else {
                (local_188->m_central_dir).m_size = local_190;
                local_174 = 1;
              }
              bVar2 = local_174 != 0;
              if (bVar2) {
                memcpy((void *)((long)(local_1a8->m_central_dir).m_p +
                               local_1c0 * (local_1a8->m_central_dir).m_element_size),local_1b0,
                       orig_size_4 * (local_1a8->m_central_dir).m_element_size);
              }
              local_198 = (uint)bVar2;
              if (local_198 != 0) {
                local_1f8 = &pmStack_2b0->m_central_dir_offsets;
                local_1f0 = pFilename_local;
                local_200 = (void *)((long)&orig_central_dir_size + 4);
                orig_size_5 = 1;
                local_210 = (pmStack_2b0->m_central_dir_offsets).m_size;
                local_1e0 = local_210 + 1;
                local_1d0 = pFilename_local;
                local_1e4 = 1;
                local_1d8 = local_1f8;
                if (((pmStack_2b0->m_central_dir_offsets).m_capacity < local_1e0) &&
                   (mVar1 = mz_zip_array_ensure_capacity
                                      ((mz_zip_archive *)pFilename_local,local_1f8,local_1e0,1),
                   mVar1 == 0)) {
                  local_1c4 = 0;
                }
                else {
                  local_1d8->m_size = local_1e0;
                  local_1c4 = 1;
                }
                bVar2 = local_1c4 != 0;
                if (bVar2) {
                  memcpy((void *)((long)local_1f8->m_p + local_210 * local_1f8->m_element_size),
                         local_200,orig_size_5 * local_1f8->m_element_size);
                }
                local_1e8 = (uint)bVar2;
                if (local_1e8 != 0) {
                  return 1;
                }
              }
            }
          }
        }
      }
      local_220 = pFilename_local;
      local_228 = pmStack_2b0;
      local_234 = 0;
      local_230 = min_new_capacity;
      if ((min_new_capacity <= (pmStack_2b0->m_central_dir).m_capacity) ||
         (mVar1 = mz_zip_array_ensure_capacity
                            ((mz_zip_archive *)pFilename_local,&pmStack_2b0->m_central_dir,
                             min_new_capacity,0), mVar1 != 0)) {
        (local_228->m_central_dir).m_size = local_230;
      }
      if (pFilename_local != (char *)0x0) {
        pFilename_local[0x1c] = '\x10';
        pFilename_local[0x1d] = '\0';
        pFilename_local[0x1e] = '\0';
        pFilename_local[0x1f] = '\0';
      }
    }
  }
  else if (pZip != (mz_zip_archive *)0x0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
  }
  return 0;
}

Assistant:

static mz_bool mz_zip_writer_add_to_central_dir(mz_zip_archive *pZip, const char *pFilename, mz_uint16 filename_size,
                                                const void *pExtra, mz_uint16 extra_size, const void *pComment, mz_uint16 comment_size,
                                                mz_uint64 uncomp_size, mz_uint64 comp_size, mz_uint32 uncomp_crc32,
                                                mz_uint16 method, mz_uint16 bit_flags, mz_uint16 dos_time, mz_uint16 dos_date,
                                                mz_uint64 local_header_ofs, mz_uint32 ext_attributes,
                                                const char *user_extra_data, mz_uint user_extra_data_len)
{
    mz_zip_internal_state *pState = pZip->m_pState;
    mz_uint32 central_dir_ofs = (mz_uint32)pState->m_central_dir.m_size;
    size_t orig_central_dir_size = pState->m_central_dir.m_size;
    mz_uint8 central_dir_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];

    if (!pZip->m_pState->m_zip64)
    {
        if (local_header_ofs > 0xFFFFFFFF)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_TOO_LARGE);
    }

    /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
    if (((mz_uint64)pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size + extra_size + user_extra_data_len + comment_size) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    if (!mz_zip_writer_create_central_dir_header(pZip, central_dir_header, filename_size, extra_size + user_extra_data_len, comment_size, uncomp_size, comp_size, uncomp_crc32, method, bit_flags, dos_time, dos_date, local_header_ofs, ext_attributes))
        return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

    if ((!mz_zip_array_push_back(pZip, &pState->m_central_dir, central_dir_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)) ||
        (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pFilename, filename_size)) ||
        (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pExtra, extra_size)) ||
        (!mz_zip_array_push_back(pZip, &pState->m_central_dir, user_extra_data, user_extra_data_len)) ||
        (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pComment, comment_size)) ||
        (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &central_dir_ofs, 1)))
    {
        /* Try to resize the central directory array back into its original state. */
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    return MZ_TRUE;
}